

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O2

Vec_Wec_t * Abc_NtkFxRetrieve(Abc_Ntk_t *pNtk)

{
  char cVar1;
  int *piVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  Vec_Wec_t *p;
  Abc_Obj_t *pAVar7;
  Vec_Int_t *p_00;
  uint c;
  int i;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  char *pSop;
  
  if ((pNtk->ntkFunc != ABC_FUNC_SOP) || (pNtk->ntkType != ABC_NTK_LOGIC)) {
    __assert_fail("Abc_NtkIsSopLogic(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFx.c"
                  ,0x91,"Vec_Wec_t *Abc_NtkFxRetrieve(Abc_Ntk_t *)");
  }
  p = Vec_WecAlloc(1000);
  i = 0;
  while( true ) {
    if (pNtk->vObjs->nSize <= i) {
      return p;
    }
    pAVar7 = Abc_NtkObj(pNtk,i);
    if ((pAVar7 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar7->field_0x14 & 0xf) == 7)) break;
LAB_0024717b:
    i = i + 1;
  }
  pSop = (char *)(pAVar7->field_5).pData;
  iVar4 = Abc_SopGetVarNum(pSop);
  if (iVar4 != (pAVar7->vFanins).nSize) {
    __assert_fail("nVars == Abc_ObjFaninNum(pNode)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFx.c"
                  ,0x97,"Vec_Wec_t *Abc_NtkFxRetrieve(Abc_Ntk_t *)");
  }
LAB_002470af:
  if (*pSop != '\0') {
    p_00 = Vec_WecPushLevel(p);
    Vec_IntPush(p_00,pAVar7->Id);
    lVar12 = 0;
    do {
      cVar1 = pSop[lVar12];
      c = 1;
      if (cVar1 == '0') {
LAB_002470f5:
        iVar5 = Abc_Var2Lit((pAVar7->vFanins).pArray[lVar12],c);
        Vec_IntPush(p_00,iVar5);
      }
      else {
        if (cVar1 == '1') {
          c = 0;
          goto LAB_002470f5;
        }
        if ((cVar1 == '\0') || (cVar1 == ' ')) goto LAB_00247112;
      }
      lVar12 = lVar12 + 1;
    } while( true );
  }
  goto LAB_0024717b;
LAB_00247112:
  uVar6 = p_00->nSize - 1;
  if (1 < (int)uVar6) {
    c = uVar6;
  }
  piVar2 = p_00->pArray;
  uVar8 = 1;
  for (uVar9 = 0; uVar9 != c - 1; uVar9 = uVar9 + 1) {
    uVar11 = uVar9 & 0xffffffff;
    for (uVar10 = uVar8; lVar12 = (long)(int)uVar11, uVar6 != uVar10; uVar10 = uVar10 + 1) {
      uVar3 = uVar10 & 0xffffffff;
      if (piVar2[lVar12 + 1] <= piVar2[uVar10 + 1]) {
        uVar3 = uVar11;
      }
      uVar11 = uVar3;
    }
    iVar5 = piVar2[uVar9 + 1];
    piVar2[uVar9 + 1] = piVar2[lVar12 + 1];
    piVar2[lVar12 + 1] = iVar5;
    uVar8 = uVar8 + 1;
  }
  pSop = pSop + (iVar4 + 3);
  goto LAB_002470af;
}

Assistant:

Vec_Wec_t * Abc_NtkFxRetrieve( Abc_Ntk_t * pNtk )
{
    Vec_Wec_t * vCubes;
    Vec_Int_t * vCube;
    Abc_Obj_t * pNode;
    char * pCube, * pSop;
    int nVars, i, v, Lit;
    assert( Abc_NtkIsSopLogic(pNtk) );
    vCubes = Vec_WecAlloc( 1000 );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        pSop = (char *)pNode->pData;
        nVars = Abc_SopGetVarNum(pSop);
        assert( nVars == Abc_ObjFaninNum(pNode) );
//        if ( nVars < 2 ) continue;
        Abc_SopForEachCube( pSop, nVars, pCube )
        {
            vCube = Vec_WecPushLevel( vCubes );
            Vec_IntPush( vCube, Abc_ObjId(pNode) );
            Abc_CubeForEachVar( pCube, Lit, v )
            {
                if ( Lit == '0' )
                    Vec_IntPush( vCube, Abc_Var2Lit(Abc_ObjFaninId(pNode, v), 1) );
                else if ( Lit == '1' )
                    Vec_IntPush( vCube, Abc_Var2Lit(Abc_ObjFaninId(pNode, v), 0) );
            }
            Vec_IntSelectSort( Vec_IntArray(vCube) + 1, Vec_IntSize(vCube) - 1 );
        }
    }
    return vCubes;
}